

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int do_hex_dump(BIO *out,uchar *buf,int buflen)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  char hextmp [2];
  undefined8 uStack_38;
  
  if ((out != (BIO *)0x0) && (buflen != 0)) {
    lVar2 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT17("0123456789ABCDEF"[buf[lVar2] & 0xf],
                           CONCAT16("0123456789ABCDEF"[buf[lVar2] >> 4],(undefined6)uStack_38));
      iVar1 = BIO_write((BIO *)out,(void *)((long)&uStack_38 + 6),2);
      if (iVar1 != 2) {
        return -1;
      }
      lVar2 = lVar2 + 1;
    } while (buflen != lVar2);
  }
  return buflen * 2;
}

Assistant:

static int do_hex_dump(BIO *out, unsigned char *buf, int buflen) {
  static const char hexdig[] = "0123456789ABCDEF";
  unsigned char *p, *q;
  char hextmp[2];
  if (out) {
    p = buf;
    q = buf + buflen;
    while (p != q) {
      hextmp[0] = hexdig[*p >> 4];
      hextmp[1] = hexdig[*p & 0xf];
      if (!maybe_write(out, hextmp, 2)) {
        return -1;
      }
      p++;
    }
  }
  return buflen << 1;
}